

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndr.h
# Opt level: O0

int Ndr_AddModule(void *pDesign,int Name)

{
  int i;
  int Mod;
  Ndr_Data_t *p;
  int Name_local;
  void *pDesign_local;
  
  i = *pDesign;
  Ndr_DataResize((Ndr_Data_t *)pDesign,6);
  Ndr_DataPush((Ndr_Data_t *)pDesign,2,0);
  Ndr_DataPush((Ndr_Data_t *)pDesign,7,Name);
  Ndr_DataAddTo((Ndr_Data_t *)pDesign,i,*pDesign - i);
  Ndr_DataAddTo((Ndr_Data_t *)pDesign,0,*pDesign - i);
  if (**(int **)((long)pDesign + 0x10) == *pDesign) {
    return i + 0x100;
  }
  __assert_fail("(int)p->pBody[0] == p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                ,0x21c,"int Ndr_AddModule(void *, int)");
}

Assistant:

static inline int Ndr_AddModule( void * pDesign, int Name )
{
    Ndr_Data_t * p = (Ndr_Data_t *)pDesign;
    int Mod = p->nSize;  
    Ndr_DataResize( p, 6 );
    Ndr_DataPush( p, NDR_MODULE, 0 );
    Ndr_DataPush( p, NDR_NAME, Name );
    Ndr_DataAddTo( p, Mod, p->nSize - Mod );
    Ndr_DataAddTo( p, 0, p->nSize - Mod );
    assert( (int)p->pBody[0] == p->nSize );
    return Mod + 256;
}